

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O2

Guild_Member * __thiscall Guild_Create::GetMember(Guild_Create *this,string *character)

{
  __shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Alloc_hider _Var2;
  __type _Var3;
  __shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  shared_ptr<Guild_Member> check;
  string local_50;
  
  util::lowercase(&local_50,character);
  std::__cxx11::string::operator=((string *)character,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  p_Var4 = &((this->members).
             super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>;
  p_Var1 = &((this->members).
             super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>;
  do {
    if (p_Var4 == p_Var1) {
      return (Guild_Member *)0x0;
    }
    std::__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> *)&local_50,p_Var4);
    _Var3 = std::operator==(character,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50._M_dataplus._M_p);
    _Var2._M_p = local_50._M_dataplus._M_p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
    p_Var4 = p_Var4 + 1;
  } while (!_Var3);
  return (Guild_Member *)_Var2._M_p;
}

Assistant:

Guild_Member *Guild_Create::GetMember(std::string character)
{
	character = util::lowercase(character);

	UTIL_FOREACH(this->members, check)
	{
		if (character == check->name)
		{
			return check.get();
		}
	}

	return 0;
}